

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Heap.h
# Opt level: O0

void __thiscall
Minisat::Heap<Minisat::SimpSolver::ElimLt>::insert(Heap<Minisat::SimpSolver::ElimLt> *this,int n)

{
  int iVar1;
  int *piVar2;
  int in_ESI;
  long in_RDI;
  int in_stack_0000000c;
  Heap<Minisat::SimpSolver::ElimLt> *in_stack_00000010;
  int *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  
  vec<int>::growTo((vec<int> *)CONCAT44(in_ESI,0xffffffff),(int)((ulong)in_RDI >> 0x20),
                   (int *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
  iVar1 = vec<int>::size((vec<int> *)(in_RDI + 8));
  piVar2 = vec<int>::operator[]((vec<int> *)(in_RDI + 0x18),in_ESI);
  *piVar2 = iVar1;
  vec<int>::push((vec<int> *)CONCAT44(iVar1,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffd8);
  vec<int>::operator[]((vec<int> *)(in_RDI + 0x18),in_ESI);
  percolateUp(in_stack_00000010,in_stack_0000000c);
  return;
}

Assistant:

void insert(int n)
    {
        indices.growTo(n + 1, -1);
        assert(!inHeap(n));

        indices[n] = heap.size();
        heap.push(n);
        percolateUp(indices[n]);
    }